

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_function.hpp
# Opt level: O0

bool duckdb::MultiFileFunction<duckdb::CSVMultiFileInfo>::TryInitializeNextBatch
               (ClientContext *context,MultiFileBindData *bind_data,MultiFileLocalState *scan_data,
               MultiFileGlobalState *gstate)

{
  long lVar1;
  bool bVar2;
  LocalTableFunctionState *lstate_p;
  undefined8 uVar3;
  __int_type _Var4;
  long in_RCX;
  long in_RDX;
  MultiFileGlobalState *in_RDI;
  unique_lock<std::mutex> *in_stack_00000038;
  MultiFileGlobalState *in_stack_00000040;
  MultiFileLocalState *in_stack_00000048;
  MultiFileBindData *in_stack_00000050;
  ClientContext *in_stack_00000058;
  MultiFileLocalState *in_stack_00000060;
  MultiFileReaderData *in_stack_00000068;
  ClientContext *in_stack_00000070;
  idx_t old_file_index;
  MultiFileReaderData *current_reader_data;
  unique_lock<std::mutex> parallel_lock;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  type in_stack_fffffffffffffee0;
  MultiFileGlobalState *in_stack_fffffffffffffee8;
  ClientContext *in_stack_fffffffffffffef0;
  MultiFileGlobalState *in_stack_fffffffffffffef8;
  unique_lock<std::mutex> *in_stack_ffffffffffffff10;
  MultiFileGlobalState *in_stack_ffffffffffffff18;
  ClientContext *in_stack_ffffffffffffff20;
  ClientContext *in_stack_ffffffffffffff30;
  ClientContext *pCVar5;
  MultiFileGlobalState *in_stack_ffffffffffffff38;
  GlobalTableFunctionState *in_stack_ffffffffffffff48;
  shared_ptr<duckdb::BaseFileReader,_true> *in_stack_ffffffffffffff50;
  ClientContext *in_stack_ffffffffffffff58;
  allocator local_79;
  string local_78 [32];
  ClientContext *local_58;
  undefined4 local_3c;
  long local_28;
  long local_20;
  MultiFileGlobalState *local_10;
  byte local_1;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_10 = in_RDI;
  ::std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)in_stack_fffffffffffffee0,
             (mutex_type *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
LAB_014cec90:
  do {
    if ((*(byte *)(local_28 + 0x50) & 1) != 0) {
      local_1 = 0;
LAB_014cf190:
      local_3c = 1;
      ::std::unique_lock<std::mutex>::~unique_lock
                ((unique_lock<std::mutex> *)in_stack_fffffffffffffee0);
      return (bool)(local_1 & 1);
    }
    bVar2 = HasFilesToRead(in_stack_fffffffffffffef8,
                           (unique_lock<std::mutex> *)in_stack_fffffffffffffef0);
    if ((!bVar2) &&
       (bVar2 = TryGetNextFile(in_stack_ffffffffffffff38,
                               (unique_lock<std::mutex> *)in_stack_ffffffffffffff30), !bVar2)) {
      unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
      ::operator*((unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
                   *)in_stack_fffffffffffffee0);
      unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>,_true>
      ::operator*((unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>,_true>
                   *)in_stack_fffffffffffffee0);
      CSVMultiFileInfo::FinishReading
                (in_stack_ffffffffffffff20,
                 &in_stack_ffffffffffffff18->super_GlobalTableFunctionState,
                 (LocalTableFunctionState *)in_stack_ffffffffffffff10);
      local_1 = 0;
      goto LAB_014cf190;
    }
    in_stack_ffffffffffffff38 = (MultiFileGlobalState *)(local_28 + 0x68);
    ::std::__atomic_base::operator_cast_to_unsigned_long
              ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffee8);
    lstate_p = (LocalTableFunctionState *)
               vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_true>
               ::operator[]((vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_true>
                             *)in_stack_fffffffffffffee0,
                            CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
    in_stack_ffffffffffffff30 =
         (ClientContext *)
         unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
         ::operator*((unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
                      *)in_stack_fffffffffffffee0);
    local_58 = in_stack_ffffffffffffff30;
    if ((in_stack_ffffffffffffff30->interrupted)._M_base._M_i != true) {
      if ((in_stack_ffffffffffffff30->interrupted)._M_base._M_i == true) {
        ::std::__atomic_base<unsigned_long>::operator++
                  ((__atomic_base<unsigned_long> *)(local_28 + 0x58));
      }
      else {
        in_stack_fffffffffffffedf =
             TryOpenNextFile(in_stack_00000058,in_stack_00000050,in_stack_00000048,in_stack_00000040
                             ,in_stack_00000038);
        if ((!(bool)in_stack_fffffffffffffedf) && ((local_58->interrupted)._M_base._M_i == true)) {
          ::std::__atomic_base::operator_cast_to_unsigned_long
                    ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffee8);
          WaitForFile((idx_t)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                      in_stack_ffffffffffffff10);
        }
      }
      goto LAB_014cec90;
    }
    in_stack_ffffffffffffff18 = local_10;
    pCVar5 = in_stack_ffffffffffffff30;
    unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
    ::operator*((unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
                 *)in_stack_fffffffffffffee0);
    in_stack_ffffffffffffff10 =
         (unique_lock<std::mutex> *)
         unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>,_true>
         ::operator*((unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>,_true>
                      *)in_stack_fffffffffffffee0);
    bVar2 = CSVMultiFileInfo::TryInitializeScan
                      (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48
                       ,lstate_p);
    if (bVar2) {
      bVar2 = duckdb::shared_ptr::operator_cast_to_bool
                        ((shared_ptr<duckdb::BaseFileReader,_true> *)0x14cee8a);
      if (!bVar2) {
        uVar3 = __cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_78,"MultiFileReader was moved",&local_79);
        InternalException::InternalException
                  ((InternalException *)in_stack_fffffffffffffee0,
                   (string *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
        __cxa_throw(uVar3,&InternalException::typeinfo,InternalException::~InternalException);
      }
      lVar1 = *(long *)(local_28 + 0x80);
      *(long *)(local_28 + 0x80) = lVar1 + 1;
      *(long *)(local_20 + 0x28) = lVar1;
      lVar1 = *(long *)(local_20 + 0x30);
      _Var4 = ::std::__atomic_base::operator_cast_to_unsigned_long
                        ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffee8);
      *(__int_type *)(local_20 + 0x30) = _Var4;
      if (lVar1 != *(long *)(local_20 + 0x30)) {
        InitializeFileScanState
                  (in_stack_00000070,in_stack_00000068,in_stack_00000060,
                   (vector<unsigned_long,_true> *)in_stack_00000058);
      }
      local_1 = 1;
      goto LAB_014cf190;
    }
    ::std::__atomic_base<unsigned_long>::operator++
              ((__atomic_base<unsigned_long> *)(local_28 + 0x58));
    (local_58->interrupted)._M_base._M_i = true;
    in_stack_fffffffffffffee8 = local_10;
    in_stack_fffffffffffffef0 =
         (ClientContext *)
         unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
         ::operator*((unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
                      *)in_stack_fffffffffffffee0);
    in_stack_fffffffffffffee0 =
         shared_ptr<duckdb::BaseFileReader,_true>::operator*
                   ((shared_ptr<duckdb::BaseFileReader,_true> *)in_stack_fffffffffffffee0);
    CSVMultiFileInfo::FinishFile
              (in_stack_fffffffffffffef0,&in_stack_fffffffffffffee8->super_GlobalTableFunctionState,
               in_stack_fffffffffffffee0);
    weak_ptr<duckdb::BaseFileReader,_true>::operator=<duckdb::BaseFileReader,_0>
              ((weak_ptr<duckdb::BaseFileReader,_true> *)in_stack_fffffffffffffee0,
               (shared_ptr<duckdb::BaseFileReader,_true> *)
               CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
    shared_ptr<duckdb::BaseFileReader,_true>::shared_ptr
              ((shared_ptr<duckdb::BaseFileReader,_true> *)in_stack_fffffffffffffee0,
               (nullptr_t)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
    shared_ptr<duckdb::BaseFileReader,_true>::operator=
              ((shared_ptr<duckdb::BaseFileReader,_true> *)in_stack_fffffffffffffef0,
               (shared_ptr<duckdb::BaseFileReader,_true> *)in_stack_fffffffffffffee8);
    shared_ptr<duckdb::BaseFileReader,_true>::~shared_ptr
              ((shared_ptr<duckdb::BaseFileReader,_true> *)0x14cf0e3);
    in_stack_ffffffffffffff20 = in_stack_ffffffffffffff30;
    in_stack_ffffffffffffff30 = pCVar5;
  } while( true );
}

Assistant:

static bool TryInitializeNextBatch(ClientContext &context, const MultiFileBindData &bind_data,
	                                   MultiFileLocalState &scan_data, MultiFileGlobalState &gstate) {
		unique_lock<mutex> parallel_lock(gstate.lock);

		while (true) {
			if (gstate.error_opening_file) {
				return false;
			}

			//! If we don't have a file to read, and the MultiFileList has no new file for us - end the scan
			if (!HasFilesToRead(gstate, parallel_lock) && !TryGetNextFile(gstate, parallel_lock)) {
				OP::FinishReading(context, *gstate.global_state, *scan_data.local_state);
				return false;
			}

			auto &current_reader_data = *gstate.readers[gstate.file_index];
			if (current_reader_data.file_state == MultiFileFileState::OPEN) {
				if (OP::TryInitializeScan(context, current_reader_data.reader, *gstate.global_state,
				                          *scan_data.local_state)) {
					if (!current_reader_data.reader) {
						throw InternalException("MultiFileReader was moved");
					}
					// The current reader has data left to be scanned
					scan_data.batch_index = gstate.batch_index++;
					auto old_file_index = scan_data.file_index;
					scan_data.file_index = gstate.file_index;
					if (old_file_index != scan_data.file_index) {
						InitializeFileScanState(context, current_reader_data, scan_data, gstate.projection_ids);
					}
					return true;
				} else {
					// Set state to the next file
					++gstate.file_index;

					// Close current file
					current_reader_data.file_state = MultiFileFileState::CLOSED;

					//! Finish processing the file
					OP::FinishFile(context, *gstate.global_state, *current_reader_data.reader);
					current_reader_data.closed_reader = current_reader_data.reader;
					current_reader_data.reader = nullptr;
					continue;
				}
			} else if (current_reader_data.file_state == MultiFileFileState::SKIPPED) {
				//! This file does not need to be opened or closed, the filters have determined that this file can be
				//! skipped entirely
				++gstate.file_index;
				continue;
			}

			if (TryOpenNextFile(context, bind_data, scan_data, gstate, parallel_lock)) {
				continue;
			}

			// Check if the current file is being opened, in that case we need to wait for it.
			if (current_reader_data.file_state == MultiFileFileState::OPENING) {
				WaitForFile(gstate.file_index, gstate, parallel_lock);
			}
		}
	}